

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O3

void __thiscall SQGenerator::Kill(SQGenerator *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQObjectPtr local_18;
  
  this->_state = eDead;
  local_18.super_SQObject._type = OT_NULL;
  local_18.super_SQObject._unVal.pTable = (SQTable *)0x0;
  sqvector<SQObjectPtr>::resize(&this->_stack,0,&local_18);
  SQObjectPtr::~SQObjectPtr(&local_18);
  pSVar3 = (this->_closure).super_SQObject._unVal.pTable;
  SVar2 = (this->_closure).super_SQObject._type;
  (this->_closure).super_SQObject._type = OT_NULL;
  (this->_closure).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  return;
}

Assistant:

void Kill(){
        _state=eDead;
        _stack.resize(0);
        _closure.Null();}